

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_main.cpp
# Opt level: O2

void Cmd_texture_browse(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  FTextureID intval;
  char *pcVar2;
  
  iVar1 = FCommandLine::argc(argv);
  if (1 < iVar1) {
    pcVar2 = FCommandLine::operator[](argv,1);
    intval = FTextureManager::CheckForTexture(&TexMan,pcVar2,0,1);
    if (intval.texnum == -1) {
      pcVar2 = FCommandLine::operator[](argv,1);
      Printf("Texture %s not found\n",pcVar2);
    }
    FIntCVar::operator=(&texture_browse_index,intval.texnum);
    return;
  }
  Printf("Usage: texture_browse <name>\n");
  return;
}

Assistant:

CCMD(texture_browse)
{
	if (argv.argc() > 1)
	{
		const int index = TexMan.CheckForTexture(argv[1], FTexture::TEX_Any).GetIndex();

		if (-1 == index)
		{
			Printf("Texture %s not found\n", argv[1]);
		}

		texture_browse_index = index;
	}
	else
	{
		Printf("Usage: texture_browse <name>\n");
	}
}